

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandBmc3(Abc_Frame_t *pAbc,int argc,char **argv)

{
  long lVar1;
  int iVar2;
  Abc_NtkType_t AVar3;
  Abc_NtkFunc_t AVar4;
  int iVar5;
  char *pcVar6;
  Vec_Ptr_t *local_f8;
  char *local_f0;
  int local_e4;
  uint local_d4;
  int c;
  int fOrDecomp;
  char *pLogFileName;
  Vec_Int_t *vStatuses;
  Vec_Ptr_t *vSeqModelVec;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtkRes;
  Saig_ParBmc_t *pPars;
  Saig_ParBmc_t Pars;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtkRes = (Abc_Ntk_t *)&pPars;
  Pars.pFuncOnFail = (_func_int_int_Abc_Cex_t_ptr *)argv;
  vSeqModelVec = (Vec_Ptr_t *)Abc_FrameReadNtk(pAbc);
  vStatuses = (Vec_Int_t *)0x0;
  pLogFileName = (char *)0x0;
  _c = (char *)0x0;
  local_d4 = 0;
  Saig_ParBmcSetDefaultParams((Saig_ParBmc_t *)pNtkRes);
  Extra_UtilGetoptReset();
LAB_0023ef52:
  do {
    iVar2 = Extra_UtilGetopt(argc,(char **)Pars.pFuncOnFail,"SFTHGCDJIPQRLWaxdruvzh");
    if (iVar2 == -1) {
      if (vSeqModelVec == (Vec_Ptr_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar2 = Abc_NtkIsStrash((Abc_Ntk_t *)vSeqModelVec);
      if (iVar2 == 0) {
        Abc_Print(-1,"Currently only works for structurally hashed circuits.\n");
        return 0;
      }
      iVar2 = Abc_NtkLatchNum((Abc_Ntk_t *)vSeqModelVec);
      if (iVar2 == 0) {
        Abc_Print(-1,"Does not work for combinational networks.\n");
        return 0;
      }
      iVar2 = Abc_NtkConstrNum((Abc_Ntk_t *)vSeqModelVec);
      if (iVar2 < 1) {
        *(int *)((long)&pNtkRes->vPis + 4) = pAbc->fBridgeMode;
        iVar2 = Abc_NtkDarBmc3((Abc_Ntk_t *)vSeqModelVec,(Saig_ParBmc_t *)pNtkRes,local_d4);
        pAbc->Status = iVar2;
        lVar1._0_4_ = vSeqModelVec[0x14].nCap;
        lVar1._4_4_ = vSeqModelVec[0x14].nSize;
        if (lVar1 == 0) {
          local_e4 = *(int *)((long)&pNtkRes->vLtlProperties + 4);
        }
        else {
          local_e4 = -1;
        }
        pAbc->nFrames = local_e4;
        if (_c != (char *)0x0) {
          Abc_NtkWriteLogFile(_c,pAbc->pCex,pAbc->Status,pAbc->nFrames,"bmc3");
        }
        vStatuses = *(Vec_Int_t **)(vSeqModelVec + 0x14);
        vSeqModelVec[0x14].nCap = 0;
        vSeqModelVec[0x14].nSize = 0;
        if ((*(int *)((long)&pNtkRes->vObjs + 4) != 0) && (*(int *)&pNtkRes->vPos != 0)) {
          if ((Vec_Ptr_t *)vStatuses == (Vec_Ptr_t *)0x0) {
            Abc_Print(1,"The array of counter-examples is not available.\n");
          }
          else {
            iVar2 = Vec_PtrSize((Vec_Ptr_t *)vStatuses);
            iVar5 = Abc_NtkPoNum((Abc_Ntk_t *)vSeqModelVec);
            if (iVar2 == iVar5) {
              Abc_NtkDropSatOutputs
                        ((Abc_Ntk_t *)vSeqModelVec,(Vec_Ptr_t *)vStatuses,*(int *)&pNtkRes->vPios);
              pNtk = Abc_NtkDarLatchSweep((Abc_Ntk_t *)vSeqModelVec,1,1,1,0,-1,-1,0,0);
              if (pNtk == (Abc_Ntk_t *)0x0) {
                Abc_Print(-1,"Removing SAT outputs has failed.\n");
                return 1;
              }
              Abc_FrameReplaceCurrentNetwork(pAbc,pNtk);
            }
            else {
              Abc_Print(1,"The array size does not match the number of outputs.\n");
            }
          }
        }
        pLogFileName = (char *)Abc_FrameDeriveStatusArray((Vec_Ptr_t *)vStatuses);
        Abc_FrameReplacePoStatuses(pAbc,(Vec_Int_t **)&pLogFileName);
        if (vStatuses == (Vec_Int_t *)0x0) {
          Abc_FrameReplaceCex(pAbc,(Abc_Cex_t **)&vSeqModelVec[0x13].pArray);
        }
        else {
          Abc_FrameReplaceCexVec(pAbc,(Vec_Ptr_t **)&vStatuses);
        }
        return 0;
      }
      Abc_Print(-1,"Constraints have to be folded (use \"fold\").\n");
      return 0;
    }
    switch(iVar2) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_0023f95b;
      }
      iVar2 = atoi(*(char **)(Pars.pFuncOnFail + (long)globalUtilOptind * 8));
      *(int *)&pNtkRes->pName = iVar2;
      AVar3 = *(Abc_NtkType_t *)&pNtkRes->pName;
      break;
    case 0x44:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-D\" should be followed by an integer.\n");
        goto LAB_0023f95b;
      }
      iVar2 = atoi(*(char **)(Pars.pFuncOnFail + (long)globalUtilOptind * 8));
      *(int *)((long)&pNtkRes->pName + 4) = iVar2;
      AVar3 = *(Abc_NtkType_t *)((long)&pNtkRes->pName + 4);
      break;
    default:
      goto LAB_0023f95b;
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_0023f95b;
      }
      AVar4 = atoi(*(char **)(Pars.pFuncOnFail + (long)globalUtilOptind * 8));
      pNtkRes->ntkFunc = AVar4;
      AVar3 = pNtkRes->ntkFunc;
      break;
    case 0x47:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-G\" should be followed by an integer.\n");
        goto LAB_0023f95b;
      }
      iVar2 = atoi(*(char **)(Pars.pFuncOnFail + (long)globalUtilOptind * 8));
      *(int *)&pNtkRes->pManName = iVar2;
      AVar3 = *(Abc_NtkType_t *)&pNtkRes->pManName;
      break;
    case 0x48:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-H\" should be followed by an integer.\n");
        goto LAB_0023f95b;
      }
      iVar2 = atoi(*(char **)(Pars.pFuncOnFail + (long)globalUtilOptind * 8));
      *(int *)((long)&pNtkRes->pManName + 4) = iVar2;
      AVar3 = *(Abc_NtkType_t *)((long)&pNtkRes->pManName + 4);
      break;
    case 0x49:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
        goto LAB_0023f95b;
      }
      iVar2 = atoi(*(char **)(Pars.pFuncOnFail + (long)globalUtilOptind * 8));
      *(int *)&pNtkRes->vObjs = iVar2;
      AVar3 = *(Abc_NtkType_t *)&pNtkRes->vObjs;
      break;
    case 0x4a:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-J\" should be followed by an integer.\n");
        goto LAB_0023f95b;
      }
      iVar2 = atoi(*(char **)(Pars.pFuncOnFail + (long)globalUtilOptind * 8));
      *(int *)&pNtkRes->pSpec = iVar2;
      AVar3 = *(Abc_NtkType_t *)&pNtkRes->pSpec;
      break;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by a file name.\n");
        goto LAB_0023f95b;
      }
      _c = *(char **)(Pars.pFuncOnFail + (long)globalUtilOptind * 8);
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_0023ef52;
    case 0x50:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-P\" should be followed by an integer.\n");
        goto LAB_0023f95b;
      }
      iVar2 = atoi(*(char **)(Pars.pFuncOnFail + (long)globalUtilOptind * 8));
      *(int *)((long)&pNtkRes->vCis + 4) = iVar2;
      AVar3 = *(Abc_NtkType_t *)((long)&pNtkRes->vCis + 4);
      break;
    case 0x51:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-Q\" should be followed by an integer.\n");
        goto LAB_0023f95b;
      }
      iVar2 = atoi(*(char **)(Pars.pFuncOnFail + (long)globalUtilOptind * 8));
      *(int *)&pNtkRes->vCos = iVar2;
      AVar3 = *(Abc_NtkType_t *)&pNtkRes->vCos;
      break;
    case 0x52:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-R\" should be followed by an integer.\n");
        goto LAB_0023f95b;
      }
      iVar2 = atoi(*(char **)(Pars.pFuncOnFail + (long)globalUtilOptind * 8));
      *(int *)((long)&pNtkRes->vCos + 4) = iVar2;
      AVar3 = *(Abc_NtkType_t *)((long)&pNtkRes->vCos + 4);
      break;
    case 0x53:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by an integer.\n");
        goto LAB_0023f95b;
      }
      AVar3 = atoi(*(char **)(Pars.pFuncOnFail + (long)globalUtilOptind * 8));
      pNtkRes->ntkType = AVar3;
      AVar3 = pNtkRes->ntkType;
      break;
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_0023f95b;
      }
      iVar2 = atoi(*(char **)(Pars.pFuncOnFail + (long)globalUtilOptind * 8));
      *(int *)((long)&pNtkRes->pSpec + 4) = iVar2;
      AVar3 = *(Abc_NtkType_t *)((long)&pNtkRes->pSpec + 4);
      break;
    case 0x57:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-W\" should be followed by a file name.\n");
        goto LAB_0023f95b;
      }
      pNtkRes->vBoxes = *(Vec_Ptr_t **)(Pars.pFuncOnFail + (long)globalUtilOptind * 8);
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_0023ef52;
    case 0x61:
      *(uint *)((long)&pNtkRes->vObjs + 4) = *(uint *)((long)&pNtkRes->vObjs + 4) ^ 1;
      goto LAB_0023ef52;
    case 100:
      *(uint *)&pNtkRes->vPos = *(uint *)&pNtkRes->vPos ^ 1;
      goto LAB_0023ef52;
    case 0x68:
      goto LAB_0023f95b;
    case 0x75:
      local_d4 = local_d4 ^ 1;
      goto LAB_0023ef52;
    case 0x76:
      *(uint *)&pNtkRes->vPios = *(uint *)&pNtkRes->vPios ^ 1;
      goto LAB_0023ef52;
    case 0x78:
      *(uint *)&pNtkRes->vPis = *(uint *)&pNtkRes->vPis ^ 1;
      goto LAB_0023ef52;
    case 0x7a:
      *(uint *)((long)&pNtkRes->vPios + 4) = *(uint *)((long)&pNtkRes->vPios + 4) ^ 1;
      goto LAB_0023ef52;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)AVar3 < 0) {
LAB_0023f95b:
      Abc_Print(-2,"usage: bmc3 [-SFTHGCDJIPQR num] [-LW file] [-axduvzh]\n");
      Abc_Print(-2,"\t         performs bounded model checking with dynamic unrolling\n");
      Abc_Print(-2,"\t-S num : the starting time frame [default = %d]\n",(ulong)pNtkRes->ntkType);
      Abc_Print(-2,"\t-F num : the max number of time frames (0 = unused) [default = %d]\n",
                (ulong)pNtkRes->ntkFunc);
      Abc_Print(-2,"\t-T num : runtime limit, in seconds [default = %d]\n",
                (ulong)*(uint *)((long)&pNtkRes->pSpec + 4));
      Abc_Print(-2,
                "\t-H num : runtime limit per output, in miliseconds (with \"-a\") [default = %d]\n"
                ,(ulong)*(uint *)((long)&pNtkRes->pManName + 4));
      Abc_Print(-2,"\t-G num : runtime gap since the last CEX, in seconds [default = %d]\n",
                (ulong)*(uint *)&pNtkRes->pManName);
      Abc_Print(-2,"\t-C num : max conflicts at an output [default = %d]\n",
                (ulong)*(uint *)&pNtkRes->pName);
      Abc_Print(-2,"\t-D num : max conflicts after jumping (0 = infinity) [default = %d]\n",
                (ulong)*(uint *)((long)&pNtkRes->pName + 4));
      Abc_Print(-2,"\t-J num : the number of timeframes to jump (0 = not used) [default = %d]\n",
                (ulong)*(uint *)&pNtkRes->pSpec);
      Abc_Print(-2,"\t-I num : the number of PIs to abstract [default = %d]\n",
                (ulong)*(uint *)&pNtkRes->vObjs);
      Abc_Print(-2,
                "\t-P num : the max number of learned clauses to keep (0=unused) [default = %d]\n",
                (ulong)*(uint *)((long)&pNtkRes->vCis + 4));
      Abc_Print(-2,"\t-Q num : delta value for learned clause removal [default = %d]\n",
                (ulong)*(uint *)&pNtkRes->vCos);
      Abc_Print(-2,"\t-R num : percentage to keep for learned clause removal [default = %d]\n",
                (ulong)*(uint *)((long)&pNtkRes->vCos + 4));
      if (_c == (char *)0x0) {
        local_f0 = "no logging";
      }
      else {
        local_f0 = _c;
      }
      Abc_Print(-2,"\t-L file: the log file name [default = %s]\n",local_f0);
      if (pNtkRes->vBoxes == (Vec_Ptr_t *)0x0) {
        local_f8 = (Vec_Ptr_t *)0xac3f69;
      }
      else {
        local_f8 = pNtkRes->vBoxes;
      }
      Abc_Print(-2,"\t-W file: the log file name with per-output details [default = %s]\n",local_f8)
      ;
      pcVar6 = "no";
      if (*(int *)((long)&pNtkRes->vObjs + 4) != 0) {
        pcVar6 = "yes";
      }
      Abc_Print(-2,"\t-a     : solve all outputs (do not stop when one is SAT) [default = %s]\n",
                pcVar6);
      pcVar6 = "no";
      if (*(int *)&pNtkRes->vPis != 0) {
        pcVar6 = "yes";
      }
      Abc_Print(-2,"\t-x     : toggle storing CEXes when solving all outputs [default = %s]\n",
                pcVar6);
      pcVar6 = "no";
      if (*(int *)&pNtkRes->vPos != 0) {
        pcVar6 = "yes";
      }
      Abc_Print(-2,"\t-d     : toggle dropping (replacing by 0) SAT outputs [default = %s]\n",pcVar6
               );
      pcVar6 = "not";
      if (local_d4 != 0) {
        pcVar6 = "yes";
      }
      Abc_Print(-2,"\t-u     : toggle performing structural OR-decomposition [default = %s]\n",
                pcVar6);
      pcVar6 = "no";
      if (*(int *)&pNtkRes->vPios != 0) {
        pcVar6 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar6);
      pcVar6 = "no";
      if (*(int *)((long)&pNtkRes->vPios + 4) != 0) {
        pcVar6 = "yes";
      }
      Abc_Print(-2,"\t-z     : toggle suppressing report about solved outputs [default = %s]\n",
                pcVar6);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandBmc3( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Abc_NtkDarBmc3( Abc_Ntk_t * pNtk, Saig_ParBmc_t * pPars, int fOrDecomp );
    Saig_ParBmc_t Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtkRes, * pNtk = Abc_FrameReadNtk(pAbc);
    Vec_Ptr_t * vSeqModelVec = NULL;
    Vec_Int_t * vStatuses = NULL;
    char * pLogFileName = NULL;
    int fOrDecomp = 0;
    int c;
    Saig_ParBmcSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "SFTHGCDJIPQRLWaxdruvzh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nStart < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesMax < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOut < 0 )
                goto usage;
            break;
        case 'H':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-H\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOutOne = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOutOne < 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOutGap = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOutGap < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nConfLimit < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nConfLimitJump = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nConfLimitJump < 0 )
                goto usage;
            break;
        case 'J':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-J\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesJump = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesJump < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nPisAbstract = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nPisAbstract < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLearnedStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLearnedStart < 0 )
                goto usage;
            break;
        case 'Q':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Q\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLearnedDelta = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLearnedDelta < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLearnedPerce = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLearnedPerce < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by a file name.\n" );
                goto usage;
            }
            pLogFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by a file name.\n" );
                goto usage;
            }
            pPars->pLogFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'a':
            pPars->fSolveAll ^= 1;
            break;
        case 'x':
            pPars->fStoreCex ^= 1;
            break;
        case 'd':
            pPars->fDropSatOuts ^= 1;
            break;
        case 'u':
            fOrDecomp ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'z':
            pPars->fNotVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Currently only works for structurally hashed circuits.\n" );
        return 0;
    }
    if ( Abc_NtkLatchNum(pNtk) == 0 )
    {
        Abc_Print( -1, "Does not work for combinational networks.\n" );
        return 0;
    }
    if ( Abc_NtkConstrNum(pNtk) > 0 )
    {
        Abc_Print( -1, "Constraints have to be folded (use \"fold\").\n" );
        return 0;
    }
    pPars->fUseBridge = pAbc->fBridgeMode;
    pAbc->Status = Abc_NtkDarBmc3( pNtk, pPars, fOrDecomp );
    pAbc->nFrames = pNtk->vSeqModelVec ? -1 : pPars->iFrame;
    if ( pLogFileName )
        Abc_NtkWriteLogFile( pLogFileName, pAbc->pCex, pAbc->Status, pAbc->nFrames, "bmc3" );
    vSeqModelVec = pNtk->vSeqModelVec;  pNtk->vSeqModelVec = NULL;
    if ( pPars->fSolveAll && pPars->fDropSatOuts )
    {
        if ( vSeqModelVec == NULL )
            Abc_Print( 1,"The array of counter-examples is not available.\n" );
        else if ( Vec_PtrSize(vSeqModelVec) != Abc_NtkPoNum(pNtk) )
            Abc_Print( 1,"The array size does not match the number of outputs.\n" );
        else
        {
            extern void Abc_NtkDropSatOutputs( Abc_Ntk_t * pNtk, Vec_Ptr_t * vCexes, int fVerbose );
            Abc_NtkDropSatOutputs( pNtk, vSeqModelVec, pPars->fVerbose );
            pNtkRes = Abc_NtkDarLatchSweep( pNtk, 1, 1, 1, 0, -1, -1, 0, 0 );
            if ( pNtkRes == NULL )
            {
                Abc_Print( -1, "Removing SAT outputs has failed.\n" );
                return 1;
            }
            Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
        }
    }
    vStatuses = Abc_FrameDeriveStatusArray( vSeqModelVec );
    Abc_FrameReplacePoStatuses( pAbc, &vStatuses );        
    if ( vSeqModelVec )
        Abc_FrameReplaceCexVec( pAbc, &vSeqModelVec );
    else
        Abc_FrameReplaceCex( pAbc, &pNtk->pSeqModel );
    return 0;

usage:
    Abc_Print( -2, "usage: bmc3 [-SFTHGCDJIPQR num] [-LW file] [-axduvzh]\n" );
    Abc_Print( -2, "\t         performs bounded model checking with dynamic unrolling\n" );
    Abc_Print( -2, "\t-S num : the starting time frame [default = %d]\n", pPars->nStart );
    Abc_Print( -2, "\t-F num : the max number of time frames (0 = unused) [default = %d]\n",      pPars->nFramesMax );
    Abc_Print( -2, "\t-T num : runtime limit, in seconds [default = %d]\n",                       pPars->nTimeOut );
    Abc_Print( -2, "\t-H num : runtime limit per output, in miliseconds (with \"-a\") [default = %d]\n",    pPars->nTimeOutOne );
    Abc_Print( -2, "\t-G num : runtime gap since the last CEX, in seconds [default = %d]\n",      pPars->nTimeOutGap );
    Abc_Print( -2, "\t-C num : max conflicts at an output [default = %d]\n",                      pPars->nConfLimit );
    Abc_Print( -2, "\t-D num : max conflicts after jumping (0 = infinity) [default = %d]\n",      pPars->nConfLimitJump );
    Abc_Print( -2, "\t-J num : the number of timeframes to jump (0 = not used) [default = %d]\n", pPars->nFramesJump );
    Abc_Print( -2, "\t-I num : the number of PIs to abstract [default = %d]\n",                   pPars->nPisAbstract );
    Abc_Print( -2, "\t-P num : the max number of learned clauses to keep (0=unused) [default = %d]\n", pPars->nLearnedStart );
    Abc_Print( -2, "\t-Q num : delta value for learned clause removal [default = %d]\n",          pPars->nLearnedDelta );
    Abc_Print( -2, "\t-R num : percentage to keep for learned clause removal [default = %d]\n",   pPars->nLearnedPerce );
    Abc_Print( -2, "\t-L file: the log file name [default = %s]\n",                               pLogFileName ? pLogFileName : "no logging" );
    Abc_Print( -2, "\t-W file: the log file name with per-output details [default = %s]\n",       pPars->pLogFileName ? pPars->pLogFileName : "no logging" );
    Abc_Print( -2, "\t-a     : solve all outputs (do not stop when one is SAT) [default = %s]\n", pPars->fSolveAll? "yes": "no" );
    Abc_Print( -2, "\t-x     : toggle storing CEXes when solving all outputs [default = %s]\n",   pPars->fStoreCex? "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle dropping (replacing by 0) SAT outputs [default = %s]\n",    pPars->fDropSatOuts? "yes": "no" );
    Abc_Print( -2, "\t-u     : toggle performing structural OR-decomposition [default = %s]\n",   fOrDecomp? "yes": "not" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n",                           pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-z     : toggle suppressing report about solved outputs [default = %s]\n",  pPars->fNotVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}